

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

size_t __thiscall
robin_hood::detail::
Table<true,80ul,std::__cxx11::string,Rml::Keyframes,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::findIdx<std::__cxx11::string>
          (Table<true,80ul,std::__cxx11::string,Rml::Keyframes,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  DataNode<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyframes,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
  *__first;
  size_t sVar1;
  bool bVar2;
  type pbVar3;
  DataNode<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyframes,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
  *__last;
  size_t local_50;
  InfoType local_2c;
  size_t sStack_28;
  InfoType info;
  size_t idx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_local;
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyframes,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  sStack_28 = 0;
  local_2c = 0;
  idx = (size_t)key;
  key_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  keyToIdx<std::__cxx11::string_const&>(this,key,&stack0xffffffffffffffd8,&local_2c);
  do {
    sVar1 = idx;
    if (local_2c == *(byte *)(sStack_28 + *(long *)(this + 8))) {
      pbVar3 = DataNode<robin_hood::detail::Table<true,80ul,std::__cxx11::string,Rml::Keyframes,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>,true>
               ::getFirst<robin_hood::pair<std::__cxx11::string,Rml::Keyframes>>
                         ((DataNode<robin_hood::detail::Table<true,80ul,std::__cxx11::string,Rml::Keyframes,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>,true>
                           *)(*(long *)this + sStack_28 * 0x50));
      bVar2 = std::
              equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)sVar1,pbVar3);
      if (bVar2) {
        return sStack_28;
      }
    }
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyframes,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::next((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyframes,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this,&local_2c,&stack0xffffffffffffffd8);
    sVar1 = idx;
    if (local_2c == *(byte *)(sStack_28 + *(long *)(this + 8))) {
      pbVar3 = DataNode<robin_hood::detail::Table<true,80ul,std::__cxx11::string,Rml::Keyframes,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>,true>
               ::getFirst<robin_hood::pair<std::__cxx11::string,Rml::Keyframes>>
                         ((DataNode<robin_hood::detail::Table<true,80ul,std::__cxx11::string,Rml::Keyframes,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>,true>
                           *)(*(long *)this + sStack_28 * 0x50));
      bVar2 = std::
              equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)sVar1,pbVar3);
      if (bVar2) {
        return sStack_28;
      }
    }
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyframes,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::next((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyframes,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this,&local_2c,&stack0xffffffffffffffd8);
  } while (local_2c <= *(byte *)(sStack_28 + *(long *)(this + 8)));
  if (*(long *)(this + 0x18) == 0) {
    local_50 = 0;
  }
  else {
    __first = *(DataNode<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyframes,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                **)this;
    __last = reinterpret_cast_no_cast_align_warning<robin_hood::detail::Table<true,80ul,std::__cxx11::string,Rml::Keyframes,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>::DataNode<robin_hood::detail::Table<true,80ul,std::__cxx11::string,Rml::Keyframes,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>,true>*>
                       (*(void **)(this + 8));
    local_50 = std::
               distance<robin_hood::detail::Table<true,80ul,std::__cxx11::string,Rml::Keyframes,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>::DataNode<robin_hood::detail::Table<true,80ul,std::__cxx11::string,Rml::Keyframes,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>,true>*>
                         (__first,__last);
  }
  return local_50;
}

Assistant:

size_t findIdx(Other const& key) const {
        size_t idx{};
        InfoType info{};
        keyToIdx(key, &idx, &info);

        do {
            // unrolling this twice gives a bit of a speedup. More unrolling did not help.
            if (info == mInfo[idx] &&
                ROBIN_HOOD_LIKELY(WKeyEqual::operator()(key, mKeyVals[idx].getFirst()))) {
                return idx;
            }
            next(&info, &idx);
            if (info == mInfo[idx] &&
                ROBIN_HOOD_LIKELY(WKeyEqual::operator()(key, mKeyVals[idx].getFirst()))) {
                return idx;
            }
            next(&info, &idx);
        } while (info <= mInfo[idx]);

        // nothing found!
        return mMask == 0 ? 0
                          : static_cast<size_t>(std::distance(
                                mKeyVals, reinterpret_cast_no_cast_align_warning<Node*>(mInfo)));
    }